

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall kratos::Const::to_string_abi_cxx11_(string *__return_storage_ptr__,Const *this)

{
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  int local_294;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_290;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_280;
  Const *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_268;
  basic_string_view<char> local_258;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_220;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_210) [10];
  char *local_208;
  string *local_200;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1f8;
  basic_string_view<char> local_1e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1a0;
  char *local_198;
  string *local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  *local_140;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  *vargs_2;
  char (*local_130) [12];
  char *local_128;
  string *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_118;
  basic_string_view<char> local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  *vargs_3;
  char (*local_c0) [11];
  char *local_b8;
  string *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
  *local_10;
  
  local_280.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
        *)this;
  this_local = (Const *)__return_storage_ptr__;
  if (this->num_bits_ == 0) {
    if ((((this->super_Var).is_signed_ & 1U) == 0) || (-1 < this->value_)) {
      local_294 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
      vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_long>
                 *)&this->value_;
      local_b8 = "{0}\'h{1:X}";
      local_c0 = (char (*) [11])&local_294;
      local_b0 = __return_storage_ptr__;
      fmt::v7::make_args_checked<unsigned_int,long_const&,char[11],char>
                (&local_f8,(v7 *)0x42a5b8,local_c0,(remove_reference_t<unsigned_int> *)vargs_3,
                 (remove_reference_t<const_long_&> *)in_R8);
      local_d0 = &local_f8;
      local_108 = fmt::v7::to_string_view<char,_0>(local_b8);
      local_28 = &local_118;
      local_30 = local_d0;
      local_20 = local_d0;
      local_10 = local_d0;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0x32,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_d0);
      format_str_02.size_ = local_118.desc_;
      format_str_02.data_ = (char *)local_108.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_118.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (__return_storage_ptr__,(detail *)local_108.data_,format_str_02,args_02);
    }
    else {
      local_290.int128_value._12_4_ = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
      local_290.long_long_value = -this->value_;
      local_128 = "-{0}\'h{1:X}";
      local_130 = (char (*) [12])((long)&local_290.string.size + 4);
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_long>
                 *)&local_290;
      local_120 = __return_storage_ptr__;
      fmt::v7::make_args_checked<unsigned_int,long,char[12],char>
                (&local_168,(v7 *)"-{0}\'h{1:X}",local_130,
                 (remove_reference_t<unsigned_int> *)vargs_2,(remove_reference_t<long> *)in_R8);
      local_140 = &local_168;
      local_178 = fmt::v7::to_string_view<char,_0>(local_128);
      local_50 = &local_188;
      local_58 = local_140;
      local_48 = local_140;
      local_38 = local_140;
      local_40 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0x32,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_140);
      format_str_01.size_ = local_188.desc_;
      format_str_01.data_ = (char *)local_178.size_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_188.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (__return_storage_ptr__,(detail *)local_178.data_,format_str_01,args_01);
    }
  }
  else if ((this->negative_ & 1U) == 0) {
    local_280.int_value = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->hex_value_;
    local_198 = "{0}\'h{1}";
    local_1a0 = &local_280;
    local_190 = __return_storage_ptr__;
    fmt::v7::make_args_checked<unsigned_int,std::__cxx11::string_const&,char[9],char>
              (&local_1d8,(v7 *)0x42a5ae,(char (*) [9])local_1a0,
               (remove_reference_t<unsigned_int> *)vargs_1,in_R8);
    local_1b0 = &local_1d8;
    local_1e8 = fmt::v7::to_string_view<char,_0>(local_198);
    local_a0 = &local_1f8;
    local_a8 = local_1b0;
    local_70 = local_1b0;
    local_60 = local_1b0;
    local_68 = local_a0;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_a0,0xd2,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_1b0);
    format_str_00.size_ = local_1f8.desc_;
    format_str_00.data_ = (char *)local_1e8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1f8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_1e8.data_,format_str_00,args_00);
  }
  else {
    local_280.long_long_value._4_4_ = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->hex_value_;
    local_208 = "-{0}\'h{1}";
    local_210 = (char (*) [10])((long)&local_280.string.data + 4);
    local_200 = __return_storage_ptr__;
    fmt::v7::make_args_checked<unsigned_int,std::__cxx11::string_const&,char[10],char>
              (&local_248,(v7 *)"-{0}\'h{1}",local_210,(remove_reference_t<unsigned_int> *)vargs,
               in_R8);
    local_220 = &local_248;
    local_258 = fmt::v7::to_string_view<char,_0>(local_208);
    local_90 = &local_268;
    local_98 = local_220;
    local_88 = local_220;
    local_78 = local_220;
    local_80 = local_90;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_90,0xd2,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_220);
    format_str.size_ = local_268.desc_;
    format_str.data_ = (char *)local_258.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_268.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_258.data_,format_str,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Const::to_string() const {
    if (num_bits_ != 0) {
        // very big number
        if (negative_) {
            return ::format("-{0}\'h{1}", width(), hex_value_);
        } else {
            return ::format("{0}\'h{1}", width(), hex_value_);
        }
    } else if (is_signed_ && value_ < 0) {
        return ::format("-{0}\'h{1:X}", width(), -value_);
    } else {
        return ::format("{0}\'h{1:X}", width(), value_);
    }
}